

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O1

void __thiscall
VectorFormatter<TxInUndoFormatter>::
Unser<HashVerifier<AutoFile>,std::vector<Coin,std::allocator<Coin>>>
          (VectorFormatter<TxInUndoFormatter> *this,HashVerifier<AutoFile> *s,
          vector<Coin,_std::allocator<Coin>_> *v)

{
  uint64_t uVar1;
  uint64_t __n;
  ulong uVar2;
  long in_FS_OFFSET;
  TxInUndoFormatter formatter;
  TxInUndoFormatter local_39;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<Coin,_std::allocator<Coin>_>::_M_erase_at_end
            (v,(v->super__Vector_base<Coin,_std::allocator<Coin>_>)._M_impl.super__Vector_impl_data.
               _M_start);
  uVar1 = ReadCompactSize<HashVerifier<AutoFile>>(s,true);
  if (uVar1 != 0) {
    __n = 0;
    do {
      uVar2 = __n + 0x196e6;
      __n = uVar1;
      if (uVar2 < uVar1) {
        __n = uVar2;
      }
      std::vector<Coin,_std::allocator<Coin>_>::reserve(v,__n);
      while ((ulong)(((long)(v->super__Vector_base<Coin,_std::allocator<Coin>_>)._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(v->super__Vector_base<Coin,_std::allocator<Coin>_>)._M_impl.
                            super__Vector_impl_data._M_start >> 4) * -0x5555555555555555) < __n) {
        std::vector<Coin,_std::allocator<Coin>_>::emplace_back<>(v);
        TxInUndoFormatter::Unser<HashVerifier<AutoFile>>
                  (&local_39,s,
                   (v->super__Vector_base<Coin,_std::allocator<Coin>_>)._M_impl.
                   super__Vector_impl_data._M_finish + -1);
      }
    } while (uVar2 < uVar1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Unser(Stream& s, V& v)
    {
        Formatter formatter;
        v.clear();
        size_t size = ReadCompactSize(s);
        size_t allocated = 0;
        while (allocated < size) {
            // For DoS prevention, do not blindly allocate as much as the stream claims to contain.
            // Instead, allocate in 5MiB batches, so that an attacker actually needs to provide
            // X MiB of data to make us allocate X+5 Mib.
            static_assert(sizeof(typename V::value_type) <= MAX_VECTOR_ALLOCATE, "Vector element size too large");
            allocated = std::min(size, allocated + MAX_VECTOR_ALLOCATE / sizeof(typename V::value_type));
            v.reserve(allocated);
            while (v.size() < allocated) {
                v.emplace_back();
                formatter.Unser(s, v.back());
            }
        }
    }